

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O2

UChar * u_strFromUTF8WithSub_63
                  (UChar *dest,int32_t destCapacity,int32_t *pDestLength,char *src,int32_t srcLength
                  ,UChar32 subchar,int32_t *pNumSubstitutions,UErrorCode *pErrorCode)

{
  byte bVar1;
  UChar *pUVar2;
  uint uVar3;
  int32_t iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  UChar *pUVar11;
  int32_t i;
  int32_t i_1;
  int local_58;
  int local_54;
  UChar *local_50;
  int32_t local_44;
  UChar *local_40;
  int32_t *local_38;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((((-1 < destCapacity) && (-2 < srcLength)) && (src != (char *)0x0 || srcLength == 0)) &&
       ((subchar < 0x110000 && (destCapacity == 0 || dest != (UChar *)0x0)) &&
        (subchar & 0xfffff800U) != 0xd800)) {
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = 0;
      }
      local_50 = dest + (uint)destCapacity;
      local_44 = destCapacity;
      local_40 = dest;
      local_38 = pDestLength;
      if (-1 < srcLength) {
        local_54 = 1;
        i = 0;
        local_58 = 0;
LAB_002deba2:
        uVar9 = (ulong)((long)local_50 - (long)dest) >> 1;
        uVar10 = (long)(srcLength - i) / 3;
        if ((int)uVar10 < (int)uVar9) {
          uVar9 = uVar10;
        }
        uVar10 = uVar9 & 0xffffffff;
        if (2 < (int)uVar9) {
          do {
            iVar8 = (int)uVar10;
            lVar7 = (long)i;
            lVar6 = lVar7 + 1;
            iVar5 = (int)lVar6;
            bVar1 = src[lVar7];
            if ((char)bVar1 < '\0') {
              if ((bVar1 & 0xf0) == 0xe0) {
                if (((srcLength <= (int)(lVar7 + 2)) ||
                    (((byte)" 000000000000\x1000"[bVar1 & 0xf] >> ((byte)src[lVar6] >> 5) & 1) == 0)
                    ) || (0x3f < (byte)((byte)src[lVar7 + 2] ^ 0x80))) {
LAB_002deca8:
                  if (((subchar < 0x10000) && (bVar1 < 0xf0)) || (iVar8 = iVar8 + -1, iVar8 != 0)) {
                    i = iVar5;
                    uVar3 = utf8_nextCharSafeBody_63((uint8_t *)src,&i,srcLength,(uint)bVar1,-1);
                    if ((int)uVar3 < 0) {
                      if (subchar < 0) goto LAB_002df199;
                      local_58 = local_58 + 1;
                      uVar3 = subchar;
                    }
                    if (uVar3 < 0x10000) {
                      *dest = (UChar)uVar3;
                      goto LAB_002debe8;
                    }
                    *dest = (short)(uVar3 >> 10) + L'ퟀ';
                    dest[1] = (UChar)uVar3 & 0x3ffU | 0xdc00;
                    dest = dest + 2;
                    goto LAB_002debec;
                  }
                  break;
                }
                *dest = ((byte)src[lVar6] & 0x3f) << 6 | (ushort)bVar1 << 0xc |
                        (byte)src[lVar7 + 2] ^ 0x80;
                i = i + 3;
              }
              else {
                if ((((byte)(bVar1 + 0x20) < 0xe2) || (iVar5 == srcLength)) ||
                   (0x3f < (byte)((byte)src[lVar6] ^ 0x80))) goto LAB_002deca8;
                *dest = (ushort)((bVar1 & 0x1f) << 6) | (byte)src[lVar6] ^ 0x80;
                i = i + 2;
              }
              dest = dest + 1;
            }
            else {
              *dest = (short)(char)bVar1;
              i = iVar5;
LAB_002debe8:
              dest = dest + 1;
            }
LAB_002debec:
            uVar10 = (ulong)(iVar8 - 1);
          } while (1 < iVar8);
          goto LAB_002deba2;
        }
        iVar5 = i;
        while ((iVar5 < srcLength && (dest < local_50))) {
          lVar6 = (long)iVar5;
          uVar10 = lVar6 + 1;
          i = (int32_t)uVar10;
          bVar1 = src[lVar6];
          if ((char)bVar1 < '\0') {
            if ((bVar1 & 0xf0) == 0xe0) {
              if ((((int)(lVar6 + 2) < srcLength) &&
                  (((byte)" 000000000000\x1000"[bVar1 & 0xf] >> ((byte)src[uVar10] >> 5) & 1) != 0))
                 && ((byte)((byte)src[lVar6 + 2] ^ 0x80) < 0x40)) {
                *dest = ((byte)src[uVar10] & 0x3f) << 6 | (ushort)bVar1 << 0xc |
                        (byte)src[lVar6 + 2] ^ 0x80;
                i = iVar5 + 3;
LAB_002deffa:
                uVar10 = (ulong)(uint)i;
                goto LAB_002df000;
              }
            }
            else if (((0xe1 < (byte)(bVar1 + 0x20)) && (i != srcLength)) &&
                    ((byte)((byte)src[uVar10] ^ 0x80) < 0x40)) {
              *dest = (ushort)((bVar1 & 0x1f) << 6) | (byte)src[uVar10] ^ 0x80;
              i = iVar5 + 2;
              goto LAB_002deffa;
            }
            uVar3 = utf8_nextCharSafeBody_63((uint8_t *)src,&i,srcLength,(uint)bVar1,-1);
            if ((int)uVar3 < 0) {
              if (subchar < 0) goto LAB_002df199;
              local_58 = local_58 + 1;
              uVar3 = subchar;
            }
            iVar5 = i;
            if (uVar3 < 0x10000) {
              *dest = (UChar)uVar3;
              dest = dest + 1;
            }
            else {
              *dest = (short)(uVar3 >> 10) + L'ퟀ';
              iVar8 = local_54;
              pUVar11 = dest + 1;
              if (local_50 <= dest + 1) goto LAB_002df091;
              dest[1] = (UChar)uVar3 & 0x3ffU | 0xdc00;
              dest = dest + 2;
            }
          }
          else {
            *dest = (short)(char)bVar1;
LAB_002df000:
            dest = dest + 1;
            iVar5 = (int)uVar10;
          }
        }
        local_54 = 0;
        iVar8 = local_54;
        pUVar11 = dest;
LAB_002df091:
        iVar4 = i;
        do {
          if (srcLength <= iVar4) goto LAB_002df155;
          lVar6 = (long)iVar4;
          uVar10 = lVar6 + 1;
          i = (int32_t)uVar10;
          bVar1 = src[lVar6];
          if ((char)bVar1 < '\0') {
            if ((bVar1 & 0xf0) == 0xe0) {
              if (((srcLength <= (int)(lVar6 + 2)) ||
                  (((byte)" 000000000000\x1000"[bVar1 & 0xf] >> ((byte)src[uVar10] >> 5) & 1) == 0))
                 || (-0x41 < src[lVar6 + 2])) goto LAB_002df11c;
              i = iVar4 + 3;
            }
            else {
              if ((((byte)(bVar1 + 0x20) < 0xe2) || (i == srcLength)) || (-0x41 < src[uVar10]))
              goto LAB_002df11c;
              i = iVar4 + 2;
            }
            uVar10 = (ulong)(uint)i;
          }
          iVar8 = iVar8 + 1;
          iVar4 = (int32_t)uVar10;
        } while( true );
      }
      i_1 = 0;
      iVar8 = 1;
      local_58 = 0;
      while( true ) {
        lVar6 = (long)i_1;
        bVar1 = src[lVar6];
        if ((bVar1 == 0) || (local_50 <= dest)) break;
        lVar7 = lVar6 + 1;
        if ((char)bVar1 < '\0') {
          uVar3 = (uint)bVar1;
          if ((bVar1 & 0xf0) == 0xe0) {
            if ((((byte)" 000000000000\x1000"[uVar3 & 0xf] >> ((byte)src[lVar7] >> 5) & 1) != 0) &&
               ((byte)((byte)src[lVar6 + 2] ^ 0x80) < 0x40)) {
              *dest = ((byte)src[lVar7] & 0x3f) << 6 | (ushort)bVar1 << 0xc |
                      (byte)src[lVar6 + 2] ^ 0x80;
              i_1 = i_1 + 3;
              goto LAB_002dedf7;
            }
LAB_002dee00:
            i_1 = (int32_t)lVar7;
            uVar3 = utf8_nextCharSafeBody_63((uint8_t *)src,&i_1,-1,uVar3,-1);
            if ((int)uVar3 < 0) {
              if (subchar < 0) goto LAB_002df199;
              local_58 = local_58 + 1;
              uVar3 = subchar;
            }
            if (uVar3 < 0x10000) {
              *dest = (UChar)uVar3;
              goto LAB_002ded66;
            }
            pUVar11 = dest + 1;
            *dest = (short)(uVar3 >> 10) + L'ퟀ';
            if (local_50 <= pUVar11) goto LAB_002dee6c;
            dest[1] = (UChar)uVar3 & 0x3ffU | 0xdc00;
            dest = dest + 2;
          }
          else {
            if ((0x1d < (byte)(bVar1 + 0x3e)) || (0x3f < (byte)((byte)src[lVar7] ^ 0x80)))
            goto LAB_002dee00;
            *dest = (ushort)((uVar3 & 0x1f) << 6) | (byte)src[lVar7] ^ 0x80;
            i_1 = i_1 + 2;
LAB_002dedf7:
            dest = dest + 1;
          }
        }
        else {
          *dest = (ushort)bVar1;
          i_1 = (int32_t)lVar7;
LAB_002ded66:
          dest = dest + 1;
        }
      }
      iVar8 = 0;
      pUVar11 = dest;
LAB_002dee6c:
      iVar5 = i_1;
LAB_002dee78:
      do {
        lVar6 = (long)iVar5;
        bVar1 = src[lVar6];
        if (bVar1 == 0) {
LAB_002df155:
          pUVar2 = local_40;
          if (pNumSubstitutions != (int32_t *)0x0) {
            *pNumSubstitutions = local_58;
          }
          iVar8 = iVar8 + (int)((ulong)((long)pUVar11 - (long)local_40) >> 1);
          if (local_38 != (int32_t *)0x0) {
            *local_38 = iVar8;
          }
          u_terminateUChars_63(local_40,local_44,iVar8,pErrorCode);
          return pUVar2;
        }
        uVar10 = lVar6 + 1;
        i_1 = (int32_t)uVar10;
        if ((char)bVar1 < '\0') {
          if ((bVar1 & 0xf0) == 0xe0) {
            if ((((byte)" 000000000000\x1000"[bVar1 & 0xf] >> ((byte)src[uVar10] >> 5) & 1) != 0) &&
               (src[lVar6 + 2] < -0x40)) {
              i_1 = iVar5 + 3;
LAB_002deee1:
              uVar10 = (ulong)(uint)i_1;
              goto LAB_002deee7;
            }
          }
          else if (((byte)(bVar1 + 0x3e) < 0x1e) && (src[uVar10] < -0x40)) {
            i_1 = iVar5 + 2;
            goto LAB_002deee1;
          }
          uVar3 = utf8_nextCharSafeBody_63((uint8_t *)src,&i_1,-1,(uint)bVar1,-1);
          if ((int)uVar3 < 0) {
            if (subchar < 0) {
LAB_002df199:
              *pErrorCode = U_INVALID_CHAR_FOUND;
              return (UChar *)0x0;
            }
            local_58 = local_58 + 1;
            uVar3 = subchar;
          }
          iVar8 = (iVar8 - (uint)(uVar3 < 0x10000)) + 2;
          iVar5 = i_1;
          goto LAB_002dee78;
        }
LAB_002deee7:
        iVar8 = iVar8 + 1;
        iVar5 = (int)uVar10;
      } while( true );
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (UChar *)0x0;
LAB_002df11c:
  uVar3 = utf8_nextCharSafeBody_63((uint8_t *)src,&i,srcLength,(uint)bVar1,-1);
  if ((int)uVar3 < 0) {
    if (subchar < 0) goto LAB_002df199;
    local_58 = local_58 + 1;
    uVar3 = subchar;
  }
  iVar8 = (iVar8 - (uint)(uVar3 < 0x10000)) + 2;
  goto LAB_002df091;
}

Assistant:

U_CAPI UChar* U_EXPORT2
u_strFromUTF8WithSub(UChar *dest,
              int32_t destCapacity,
              int32_t *pDestLength,
              const char* src,
              int32_t srcLength,
              UChar32 subchar, int32_t *pNumSubstitutions,
              UErrorCode *pErrorCode){
    /* args check */
    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if( (src==NULL && srcLength!=0) || srcLength < -1 ||
        (destCapacity<0) || (dest == NULL && destCapacity > 0) ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=0;
    }
    UChar *pDest = dest;
    UChar *pDestLimit = dest+destCapacity;
    int32_t reqLength = 0;
    int32_t numSubstitutions=0;

    /*
     * Inline processing of UTF-8 byte sequences:
     *
     * Byte sequences for the most common characters are handled inline in
     * the conversion loops. In order to reduce the path lengths for those
     * characters, the tests are arranged in a kind of binary search.
     * ASCII (<=0x7f) is checked first, followed by the dividing point
     * between 2- and 3-byte sequences (0xe0).
     * The 3-byte branch is tested first to speed up CJK text.
     * The compiler should combine the subtractions for the two tests for 0xe0.
     * Each branch then tests for the other end of its range.
     */

    if(srcLength < 0){
        /*
         * Transform a NUL-terminated string.
         * The code explicitly checks for NULs only in the lead byte position.
         * A NUL byte in the trail byte position fails the trail byte range check anyway.
         */
        int32_t i;
        UChar32 c;
        for(i = 0; (c = (uint8_t)src[i]) != 0 && (pDest < pDestLimit);) {
            // modified copy of U8_NEXT()
            ++i;
            if(U8_IS_SINGLE(c)) {
                *pDest++=(UChar)c;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0xf)<<12)|((src[i]&0x3f)<<6)|__t2;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0x1f)<<6)|__t1;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), -1, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    } else if(c<=0xFFFF) {
                        *(pDest++)=(UChar)c;
                    } else {
                        *(pDest++)=U16_LEAD(c);
                        if(pDest<pDestLimit) {
                            *(pDest++)=U16_TRAIL(c);
                        } else {
                            reqLength++;
                            break;
                        }
                    }
                }
            }
        }

        /* Pre-flight the rest of the string. */
        while((c = (uint8_t)src[i]) != 0) {
            // modified copy of U8_NEXT()
            ++i;
            if(U8_IS_SINGLE(c)) {
                ++reqLength;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    ++reqLength;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    ++reqLength;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), -1, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    }
                    reqLength += U16_LENGTH(c);
                }
            }
        }
    } else /* srcLength >= 0 */ {
        /* Faster loop without ongoing checking for srcLength and pDestLimit. */
        int32_t i = 0;
        UChar32 c;
        for(;;) {
            /*
             * Each iteration of the inner loop progresses by at most 3 UTF-8
             * bytes and one UChar, for most characters.
             * For supplementary code points (4 & 2), which are rare,
             * there is an additional adjustment.
             */
            int32_t count = (int32_t)(pDestLimit - pDest);
            int32_t count2 = (srcLength - i) / 3;
            if(count > count2) {
                count = count2; /* min(remaining dest, remaining src/3) */
            }
            if(count < 3) {
                /*
                 * Too much overhead if we get near the end of the string,
                 * continue with the next loop.
                 */
                break;
            }

            do {
                // modified copy of U8_NEXT()
                c = (uint8_t)src[i++];
                if(U8_IS_SINGLE(c)) {
                    *pDest++=(UChar)c;
                } else {
                    uint8_t __t1, __t2;
                    if( /* handle U+0800..U+FFFF inline */
                            (0xe0<=(c) && (c)<0xf0) &&
                            ((i)+1)<srcLength &&
                            U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                            (__t2=src[(i)+1]-0x80)<=0x3f) {
                        *pDest++ = (((c)&0xf)<<12)|((src[i]&0x3f)<<6)|__t2;
                        i+=2;
                    } else if( /* handle U+0080..U+07FF inline */
                            ((c)<0xe0 && (c)>=0xc2) &&
                            ((i)!=srcLength) &&
                            (__t1=src[i]-0x80)<=0x3f) {
                        *pDest++ = (((c)&0x1f)<<6)|__t1;
                        ++(i);
                    } else {
                        if(c >= 0xf0 || subchar > 0xffff) {
                            // We may read up to four bytes and write up to two UChars,
                            // which we didn't account for with computing count,
                            // so we adjust it here.
                            if(--count == 0) {
                                --i;  // back out byte c
                                break;
                            }
                        }

                        /* function call for "complicated" and error cases */
                        (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, c, -1);
                        if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                            *pErrorCode = U_INVALID_CHAR_FOUND;
                            return NULL;
                        } else if(c<=0xFFFF) {
                            *(pDest++)=(UChar)c;
                        } else {
                            *(pDest++)=U16_LEAD(c);
                            *(pDest++)=U16_TRAIL(c);
                        }
                    }
                }
            } while(--count > 0);
        }

        while(i < srcLength && (pDest < pDestLimit)) {
            // modified copy of U8_NEXT()
            c = (uint8_t)src[i++];
            if(U8_IS_SINGLE(c)) {
                *pDest++=(UChar)c;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        ((i)+1)<srcLength &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0xf)<<12)|((src[i]&0x3f)<<6)|__t2;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        ((i)!=srcLength) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0x1f)<<6)|__t1;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    } else if(c<=0xFFFF) {
                        *(pDest++)=(UChar)c;
                    } else {
                        *(pDest++)=U16_LEAD(c);
                        if(pDest<pDestLimit) {
                            *(pDest++)=U16_TRAIL(c);
                        } else {
                            reqLength++;
                            break;
                        }
                    }
                }
            }
        }

        /* Pre-flight the rest of the string. */
        while(i < srcLength) {
            // modified copy of U8_NEXT()
            c = (uint8_t)src[i++];
            if(U8_IS_SINGLE(c)) {
                ++reqLength;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        ((i)+1)<srcLength &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    ++reqLength;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        ((i)!=srcLength) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    ++reqLength;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    }
                    reqLength += U16_LENGTH(c);
                }
            }
        }
    }

    reqLength+=(int32_t)(pDest - dest);

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=numSubstitutions;
    }

    if(pDestLength){
        *pDestLength = reqLength;
    }

    /* Terminate the buffer */
    u_terminateUChars(dest,destCapacity,reqLength,pErrorCode);

    return dest;
}